

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

ostringstream * __thiscall
wasm::ValidationInfo::getStream_abi_cxx11_(ValidationInfo *this,Function *func)

{
  ulong uVar1;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostringstream *this_00;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  Function *func_local;
  
  local_38 = (undefined1  [8])&this->mutex;
  lock._M_device._0_1_ = 0;
  lock._8_8_ = func;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  lock._M_device._0_1_ = 1;
  uVar1 = (this->outputs)._M_h._M_bucket_count;
  uVar4 = (ulong)lock._8_8_ % uVar1;
  p_Var5 = (this->outputs)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     (_Hash_node_base *)lock._8_8_ != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (_Hash_node_base *)lock._8_8_ == p_Var3[1]._M_nxt)) goto LAB_009dc8d3;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_009dc8d3:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    this_00 = (ostringstream *)operator_new(0x178);
    std::__cxx11::ostringstream::ostringstream(this_00);
    p_Var3 = (_Hash_node_base *)
             std::__detail::
             _Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->outputs,(key_type *)&lock._M_owns);
    pbVar2 = (((__uniq_ptr_data<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)&p_Var3->_M_nxt)->
             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    (((__uniq_ptr_data<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       *)&p_Var3->_M_nxt)->
    super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
    if (pbVar2 != (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar2 + 8))();
    }
  }
  else {
    p_Var3 = p_Var3 + 2;
  }
  pbVar2 = (((__uniq_ptr_data<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              *)&p_Var3->_M_nxt)->
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return pbVar2;
}

Assistant:

std::ostringstream& getStream(Function* func) {
    std::unique_lock<std::mutex> lock(mutex);
    auto iter = outputs.find(func);
    if (iter != outputs.end()) {
      return *(iter->second.get());
    }
    auto& ret = outputs[func] = std::make_unique<std::ostringstream>();
    return *ret.get();
  }